

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::RtoIFunction::~RtoIFunction(RtoIFunction *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit RtoIFunction(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Rtoi, SubroutineKind::Function, 1,
                               {&builtins.realType}, builtins.integerType, false) {}